

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int Ifn_NtkAddClauses(Ifn_Ntk_t *p,int *pValues,sat_solver *pSat)

{
  int iVar1;
  sbyte sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  int iParStart_1;
  int nValues;
  int Count;
  int nMints;
  int m;
  int *pFans;
  int nFans;
  int iParStart;
  int nSatVars;
  int pLits2 [13];
  int local_78 [2];
  int pLits [13];
  uint local_38;
  int local_34;
  int nLits;
  int v;
  int f;
  int i;
  sat_solver *pSat_local;
  int *pValues_local;
  Ifn_Ntk_t *p_local;
  
  nFans = sat_solver_nvars(pSat);
  for (v = 0; v < p->nObjs; v = v + 1) {
    *(uint *)(p->Nodes + v) = *(uint *)(p->Nodes + v) & 0xffff | nFans << 0x10;
    nFans = nFans + 1;
  }
  sat_solver_setnvars(pSat,nFans);
  for (v = 0; v < p->nVars; v = v + 1) {
    if (pValues[v] == -1) {
      __assert_fail("pValues[i] != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x462,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
    }
  }
  for (v = p->nVars; v < p->nObjs + -1; v = v + 1) {
    if (pValues[v] != -1) {
      __assert_fail("pValues[i] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x464,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
    }
  }
  if (pValues[p->nObjs + -1] == -1) {
    __assert_fail("pValues[p->nObjs-1] != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x465,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
  }
  for (v = 0; v < p->nInps; v = v + 1) {
    iVar5 = p->nParsVIni;
    iVar1 = p->nParsVNum;
    for (local_34 = 0; local_34 < p->nVars; local_34 = local_34 + 1) {
      local_78[0] = Abc_Var2Lit(*(uint *)(p->Nodes + v) >> 0x10,(uint)(pValues[local_34] == 0));
      for (nLits = 0; nLits < p->nParsVNum; nLits = nLits + 1) {
        iVar3 = Abc_Var2Lit(iVar5 + v * iVar1 + nLits,local_34 >> ((byte)nLits & 0x1f) & 1);
        local_78[nLits + 1] = iVar3;
      }
      iVar3 = Ifn_AddClause(pSat,local_78,pLits + (long)p->nParsVNum + -1);
      if (iVar3 == 0) {
        return 0;
      }
    }
  }
  v = p->nInps;
  do {
    if (p->nObjs <= v) {
      local_78[0] = Abc_Var2Lit(*(uint *)(p->Nodes + (p->nObjs + -1)) >> 0x10,
                                (uint)(pValues[p->nObjs + -1] == 0));
      iVar5 = Ifn_AddClause(pSat,local_78,local_78 + 1);
      p_local._4_4_ = (uint)(iVar5 != 0);
      return p_local._4_4_;
    }
    uVar4 = *(uint *)(p->Nodes + v) >> 3 & 0x1f;
    piVar7 = p->Nodes[v].Fanins;
    if (((undefined1  [48])p->Nodes[v] & (undefined1  [48])0x7) == (undefined1  [48])0x3) {
      local_78[0] = Abc_Var2Lit(*(uint *)(p->Nodes + v) >> 0x10,0);
      local_38 = 1;
      for (nLits = 0; nLits < (int)uVar4; nLits = nLits + 1) {
        iVar5 = Abc_Var2Lit(*(uint *)(p->Nodes + piVar7[nLits]) >> 0x10,1);
        local_78[(int)local_38] = iVar5;
        iParStart = Abc_Var2Lit(*(uint *)(p->Nodes + v) >> 0x10,1);
        nSatVars = Abc_Var2Lit(*(uint *)(p->Nodes + piVar7[nLits]) >> 0x10,0);
        iVar5 = Ifn_AddClause(pSat,&iParStart,pLits2);
        if (iVar5 == 0) {
          return 0;
        }
        local_38 = local_38 + 1;
      }
      iVar5 = Ifn_AddClause(pSat,local_78,local_78 + (int)local_38);
      if (iVar5 == 0) {
        return 0;
      }
    }
    else {
      sVar2 = (sbyte)uVar4;
      if (((undefined1  [48])p->Nodes[v] & (undefined1  [48])0x7) == (undefined1  [48])0x4) {
        for (Count = 0; Count < 1 << (sVar2 + 1U & 0x1f); Count = Count + 1) {
          iParStart_1 = 0;
          for (local_34 = 0; local_34 <= (int)uVar4; local_34 = local_34 + 1) {
            iParStart_1 = (Count >> ((byte)local_34 & 0x1f) & 1U) + iParStart_1;
          }
          if ((iParStart_1 & 1U) != 0) {
            local_78[0] = Abc_Var2Lit(*(uint *)(p->Nodes + v) >> 0x10,Count >> sVar2 & 1);
            for (local_34 = 0; local_34 < (int)uVar4; local_34 = local_34 + 1) {
              iVar5 = Abc_Var2Lit(*(uint *)(p->Nodes + piVar7[local_34]) >> 0x10,
                                  Count >> ((byte)local_34 & 0x1f) & 1);
              local_78[local_34 + 1] = iVar5;
            }
            iVar5 = Ifn_AddClause(pSat,local_78,pLits + (long)(int)uVar4 + -1);
            if (iVar5 == 0) {
              return 0;
            }
          }
        }
      }
      else if (((undefined1  [48])p->Nodes[v] & (undefined1  [48])0x7) == (undefined1  [48])0x5) {
        local_78[0] = Abc_Var2Lit(*(uint *)(p->Nodes + v) >> 0x10,0);
        local_78[1] = Abc_Var2Lit(*(uint *)(p->Nodes + *piVar7) >> 0x10,1);
        pLits[0] = Abc_Var2Lit(*(uint *)(p->Nodes + p->Nodes[v].Fanins[1]) >> 0x10,1);
        iVar5 = Ifn_AddClause(pSat,local_78,pLits + 1);
        if (iVar5 == 0) {
          return 0;
        }
        local_78[0] = Abc_Var2Lit(*(uint *)(p->Nodes + v) >> 0x10,1);
        local_78[1] = Abc_Var2Lit(*(uint *)(p->Nodes + *piVar7) >> 0x10,1);
        pLits[0] = Abc_Var2Lit(*(uint *)(p->Nodes + p->Nodes[v].Fanins[1]) >> 0x10,0);
        iVar5 = Ifn_AddClause(pSat,local_78,pLits + 1);
        if (iVar5 == 0) {
          return 0;
        }
        local_78[0] = Abc_Var2Lit(*(uint *)(p->Nodes + v) >> 0x10,0);
        local_78[1] = Abc_Var2Lit(*(uint *)(p->Nodes + *piVar7) >> 0x10,0);
        pLits[0] = Abc_Var2Lit(*(uint *)(p->Nodes + p->Nodes[v].Fanins[2]) >> 0x10,1);
        iVar5 = Ifn_AddClause(pSat,local_78,pLits + 1);
        if (iVar5 == 0) {
          return 0;
        }
        local_78[0] = Abc_Var2Lit(*(uint *)(p->Nodes + v) >> 0x10,1);
        local_78[1] = Abc_Var2Lit(*(uint *)(p->Nodes + *piVar7) >> 0x10,0);
        pLits[0] = Abc_Var2Lit(*(uint *)(p->Nodes + p->Nodes[v].Fanins[2]) >> 0x10,0);
        iVar5 = Ifn_AddClause(pSat,local_78,pLits + 1);
        if (iVar5 == 0) {
          return 0;
        }
      }
      else {
        if (((undefined1  [48])p->Nodes[v] & (undefined1  [48])0x7) != (undefined1  [48])0x6) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                        ,0x4d7,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
        }
        uVar6 = *(uint *)(p->Nodes + v) >> 8 & 0xff;
        for (local_34 = 0; local_34 < 1 << sVar2; local_34 = local_34 + 1) {
          iVar5 = pValues[v];
          if (iVar5 == -1) {
            local_78[0] = Abc_Var2Lit(*(uint *)(p->Nodes + v) >> 0x10,0);
            iParStart = Abc_Var2Lit(*(uint *)(p->Nodes + v) >> 0x10,1);
          }
          local_38 = (uint)(iVar5 == -1);
          for (nLits = 0; nLits < (int)uVar4; nLits = nLits + 1) {
            iVar5 = Abc_Var2Lit(*(uint *)(p->Nodes + piVar7[nLits]) >> 0x10,
                                local_34 >> ((byte)nLits & 0x1f) & 1);
            (&iParStart)[(int)local_38] = iVar5;
            local_78[(int)local_38] = iVar5;
            local_38 = local_38 + 1;
          }
          iVar5 = Abc_Var2Lit(uVar6 + local_34,1);
          local_78[(int)local_38] = iVar5;
          iVar5 = Abc_Var2Lit(uVar6 + local_34,0);
          (&iParStart)[(int)local_38] = iVar5;
          if ((pValues[v] != 0) &&
             (iVar5 = Ifn_AddClause(pSat,&iParStart,&iParStart + (int)(local_38 + 1)), iVar5 == 0))
          {
            return 0;
          }
          if ((pValues[v] != 1) &&
             (iVar5 = Ifn_AddClause(pSat,local_78,local_78 + (int)(local_38 + 1)), iVar5 == 0)) {
            return 0;
          }
        }
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

int Ifn_NtkAddClauses( Ifn_Ntk_t * p, int * pValues, sat_solver * pSat )
{
    int i, f, v, nLits, pLits[IFN_INS+2], pLits2[IFN_INS+2];
    // assign new variables
    int nSatVars = sat_solver_nvars(pSat);
//    for ( i = 0; i < p->nObjs-1; i++ )
    for ( i = 0; i < p->nObjs; i++ )
        p->Nodes[i].Var = nSatVars++;
    //p->Nodes[p->nObjs-1].Var = 0xFFFF;
    sat_solver_setnvars( pSat, nSatVars );
    // verify variable values
    for ( i = 0; i < p->nVars; i++ )
        assert( pValues[i] != -1 );
    for ( i = p->nVars; i < p->nObjs-1; i++ )
        assert( pValues[i] == -1 );
    assert( pValues[p->nObjs-1] != -1 );
    // internal variables
//printf( "\n" );
    for ( i = 0; i < p->nInps; i++ )
    {
        int iParStart = p->nParsVIni + i * p->nParsVNum;
        for ( v = 0; v < p->nVars; v++ )
        {
            // add output literal
            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, pValues[v]==0 );
            // add clause literals
            for ( f = 0; f < p->nParsVNum; f++ )
                pLits[f+1] = Abc_Var2Lit( iParStart + f, (v >> f) & 1 ); 
            if ( !Ifn_AddClause( pSat, pLits, pLits+p->nParsVNum+1 ) )
                return 0;
        }
    }
//printf( "\n" );
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        if ( p->Nodes[i].Type == IFN_DSD_AND )
        {
            nLits = 0;
            pLits[nLits++] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            for ( f = 0; f < nFans; f++ )
            {
                pLits[nLits++] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, 1 );
                // add small clause
                pLits2[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
                pLits2[1] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, 0 );
                if ( !Ifn_AddClause( pSat, pLits2, pLits2 + 2 ) )
                    return 0;
            }
            // add big clause
            if ( !Ifn_AddClause( pSat, pLits, pLits + nLits ) )
                return 0;
        }
        else if ( p->Nodes[i].Type == IFN_DSD_XOR )
        {
            int m, nMints = (1 << (nFans+1));
            for ( m = 0; m < nMints; m++ )
            {
                // skip even 
                int Count = 0;
                for ( v = 0; v <= nFans; v++ )
                    Count += ((m >> v) & 1);
                if ( (Count & 1) == 0 )
                    continue;
                // generate minterm
                pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, (m >> nFans) & 1 );
                for ( v = 0; v < nFans; v++ )
                    pLits[v+1] = Abc_Var2Lit( p->Nodes[pFans[v]].Var, (m >> v) & 1 );
                if ( !Ifn_AddClause( pSat, pLits, pLits + nFans + 1 ) )
                    return 0;
            }
        }
        else if ( p->Nodes[i].Type == IFN_DSD_MUX )
        {
            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 1 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[1]].Var, 1 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 1 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[1]].Var, 0 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 0 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[2]].Var, 1 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 0 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[2]].Var, 0 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;
        }
        else if ( p->Nodes[i].Type == IFN_DSD_PRIME )
        {
            int nValues = (1 << nFans);
            int iParStart = p->Nodes[i].iFirst;
            for ( v = 0; v < nValues; v++ )
            {
                nLits = 0;
                if ( pValues[i] == -1 )
                {
                    pLits[nLits]  = Abc_Var2Lit( p->Nodes[i].Var, 0 );
                    pLits2[nLits] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
                    nLits++;
                }
                for ( f = 0; f < nFans; f++, nLits++ )
                    pLits[nLits] = pLits2[nLits] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, (v >> f) & 1 ); 
                pLits[nLits]  = Abc_Var2Lit( iParStart + v, 1 ); 
                pLits2[nLits] = Abc_Var2Lit( iParStart + v, 0 ); 
                nLits++;
                if ( pValues[i] != 0 )
                {
                    if ( !Ifn_AddClause( pSat, pLits2, pLits2 + nLits ) )
                        return 0;
                }
                if ( pValues[i] != 1 )
                {
                    if ( !Ifn_AddClause( pSat, pLits,  pLits + nLits ) )
                        return 0;
                }
            }
        }
        else assert( 0 );
//printf( "\n" );
    }
    // add last clause (not needed if the root node is IFN_DSD_PRIME)
    pLits[0] = Abc_Var2Lit( p->Nodes[p->nObjs-1].Var, pValues[p->nObjs-1]==0 );
    if ( !Ifn_AddClause( pSat, pLits,  pLits + 1 ) )
        return 0;
    return 1;
}